

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::UpdateClipRect(ImDrawList *this)

{
  int iVar1;
  uint uVar2;
  ImDrawCmd *pIVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  long lVar11;
  ImVec4 *pIVar12;
  long lVar13;
  ImTextureID pvVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ImVec4 curr_clip_rect;
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char cStack_a;
  char cStack_9;
  
  lVar11 = (long)(this->_ClipRectStack).Size;
  pIVar12 = (this->_ClipRectStack).Data + lVar11 + -1;
  if (lVar11 == 0) {
    pIVar12 = &this->_Data->ClipRectFullscreen;
  }
  uVar4 = pIVar12->x;
  uVar5 = pIVar12->y;
  uVar6 = pIVar12->z;
  uVar7 = pIVar12->w;
  iVar1 = (this->CmdBuffer).Size;
  lVar11 = (long)iVar1;
  pIVar3 = (this->CmdBuffer).Data;
  if (pIVar3 + lVar11 + -1 != (ImDrawCmd *)0x0 && 0 < lVar11) {
    uVar2 = pIVar3[lVar11 + -1].ElemCount;
    local_18 = (char)uVar4;
    cStack_17 = (char)((uint)uVar4 >> 8);
    cStack_16 = (char)((uint)uVar4 >> 0x10);
    cStack_15 = (char)((uint)uVar4 >> 0x18);
    cStack_14 = (char)uVar5;
    cStack_13 = (char)((uint)uVar5 >> 8);
    cStack_12 = (char)((uint)uVar5 >> 0x10);
    cStack_11 = (char)((uint)uVar5 >> 0x18);
    cStack_10 = (char)uVar6;
    cStack_f = (char)((uint)uVar6 >> 8);
    cStack_e = (char)((uint)uVar6 >> 0x10);
    cStack_d = (char)((uint)uVar6 >> 0x18);
    cStack_c = (char)uVar7;
    cStack_b = (char)((uint)uVar7 >> 8);
    cStack_a = (char)((uint)uVar7 >> 0x10);
    cStack_9 = (char)((uint)uVar7 >> 0x18);
    if (((uVar2 == 0) ||
        (auVar15[0] = -(*(char *)&pIVar3[lVar11 + -1].ClipRect.x == local_18),
        auVar15[1] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.x + 1) == cStack_17),
        auVar15[2] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.x + 2) == cStack_16),
        auVar15[3] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.x + 3) == cStack_15),
        auVar15[4] = -(*(char *)&pIVar3[lVar11 + -1].ClipRect.y == cStack_14),
        auVar15[5] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.y + 1) == cStack_13),
        auVar15[6] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.y + 2) == cStack_12),
        auVar15[7] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.y + 3) == cStack_11),
        auVar15[8] = -(*(char *)&pIVar3[lVar11 + -1].ClipRect.z == cStack_10),
        auVar15[9] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.z + 1) == cStack_f),
        auVar15[10] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.z + 2) == cStack_e),
        auVar15[0xb] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.z + 3) == cStack_d),
        auVar15[0xc] = -(*(char *)&pIVar3[lVar11 + -1].ClipRect.w == cStack_c),
        auVar15[0xd] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.w + 1) == cStack_b),
        auVar15[0xe] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.w + 2) == cStack_a),
        auVar15[0xf] = -(*(char *)((long)&pIVar3[lVar11 + -1].ClipRect.w + 3) == cStack_9),
        (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf
                ) == 0xffff)) && (pIVar3[lVar11 + -1].UserCallback == (ImDrawCallback)0x0)) {
      if (((1 < iVar1) && (uVar2 == 0)) &&
         (auVar16[0] = -(*(char *)&pIVar3[lVar11 + -2].ClipRect.x == local_18),
         auVar16[1] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.x + 1) == cStack_17),
         auVar16[2] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.x + 2) == cStack_16),
         auVar16[3] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.x + 3) == cStack_15),
         auVar16[4] = -(*(char *)&pIVar3[lVar11 + -2].ClipRect.y == cStack_14),
         auVar16[5] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.y + 1) == cStack_13),
         auVar16[6] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.y + 2) == cStack_12),
         auVar16[7] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.y + 3) == cStack_11),
         auVar16[8] = -(*(char *)&pIVar3[lVar11 + -2].ClipRect.z == cStack_10),
         auVar16[9] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.z + 1) == cStack_f),
         auVar16[10] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.z + 2) == cStack_e),
         auVar16[0xb] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.z + 3) == cStack_d),
         auVar16[0xc] = -(*(char *)&pIVar3[lVar11 + -2].ClipRect.w == cStack_c),
         auVar16[0xd] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.w + 1) == cStack_b),
         auVar16[0xe] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.w + 2) == cStack_a),
         auVar16[0xf] = -(*(char *)((long)&pIVar3[lVar11 + -2].ClipRect.w + 3) == cStack_9),
         (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar16[0xf] >> 7) << 0xf) == 0xffff)) {
        lVar13 = (long)(this->_TextureIdStack).Size;
        if (lVar13 == 0) {
          pvVar14 = (ImTextureID)0x0;
        }
        else {
          pvVar14 = (this->_TextureIdStack).Data[lVar13 + -1];
        }
        if ((pIVar3[lVar11 + -2].TextureId == pvVar14) &&
           (pIVar3[lVar11 + -2].UserCallback == (ImDrawCallback)0x0)) {
          if (0 < iVar1) {
            (this->CmdBuffer).Size = iVar1 + -1;
            return;
          }
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.h"
                        ,0x540,"void ImVector<ImDrawCmd>::pop_back() [T = ImDrawCmd]");
        }
      }
      fVar8 = pIVar12->y;
      fVar9 = pIVar12->z;
      fVar10 = pIVar12->w;
      pIVar3[lVar11 + -1].ClipRect.x = pIVar12->x;
      pIVar3[lVar11 + -1].ClipRect.y = fVar8;
      pIVar3[lVar11 + -1].ClipRect.z = fVar9;
      pIVar3[lVar11 + -1].ClipRect.w = fVar10;
      return;
    }
  }
  AddDrawCmd(this);
  return;
}

Assistant:

void ImDrawList::UpdateClipRect()
{
    // If current command is used with different settings we need to add a new command
    const ImVec4 curr_clip_rect = GetCurrentClipRect();
    ImDrawCmd* curr_cmd = CmdBuffer.Size > 0 ? &CmdBuffer.Data[CmdBuffer.Size-1] : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) != 0) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && memcmp(&prev_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) == 0 && prev_cmd->TextureId == GetCurrentTextureId() && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->ClipRect = curr_clip_rect;
}